

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O0

void __thiscall
slang::analysis::AnalysisManager::analyzeScopeAsync(AnalysisManager *this,Scope *scope)

{
  Scope **__x;
  bool bVar1;
  __int_type _Var2;
  __atomic_base<unsigned_long> __name;
  group_type *pgVar3;
  equal_to<const_slang::ast::Scope_*> *this_00;
  raw_key_type *__y;
  value_type *pvVar4;
  long in_RDI;
  int res;
  shared_lock_guard lck;
  value_type *p_1;
  reserve_slot rslot;
  uint n_1;
  int mask_1;
  group_exclusive_lock_guard lck_2;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  reserve_size rsize;
  uint32_t counter;
  size_t pos0;
  size_t hash;
  Scope **k;
  uint n;
  group_shared_lock_guard lck_1;
  value_type *p;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *in_stack_fffffffffffffc90;
  element_type *in_stack_fffffffffffffc98;
  reserve_slot *in_stack_fffffffffffffca0;
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *in_stack_fffffffffffffca8;
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *in_stack_fffffffffffffcb0;
  undefined1 local_2a8 [24];
  undefined1 *local_290;
  undefined1 *local_288;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *local_280;
  undefined1 local_271;
  undefined1 *local_270;
  undefined1 *local_268;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *local_260;
  undefined1 local_251;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *local_238;
  undefined1 local_229 [25];
  undefined1 *local_210;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *local_208;
  uint local_200;
  int local_1ec;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  reserve_slot *local_1b8;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *local_1b0;
  byte local_1a1;
  value_type *local_1a0;
  int local_194;
  reserve_slot local_190;
  uint local_178;
  int local_174;
  undefined1 local_170 [56];
  reserve_size local_138;
  __int_type local_11c;
  size_t local_118;
  __atomic_base<unsigned_long> local_110;
  Scope **local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  reserve_slot *local_e0;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *local_d8;
  int local_cc;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  size_t local_b0;
  size_t local_a8;
  Scope **local_a0;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *local_98;
  undefined1 local_89;
  int local_88;
  uint local_74;
  undefined1 local_70 [64];
  undefined1 **local_30;
  size_t local_28;
  size_t local_20;
  Scope **local_18;
  atomic<unsigned_long> local_10;
  long local_8;
  
  __name._M_i = in_RDI + 0x28;
  local_288 = local_2a8;
  local_290 = &std::nullopt;
  local_270 = &std::nullopt;
  local_240 = &local_271;
  local_250 = &std::nullopt;
  local_210 = &local_251;
  local_229._1_8_ = &std::nullopt;
  local_1b8 = (reserve_slot *)local_229;
  local_1d8 = &std::nullopt;
  local_280 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               *)__name._M_i;
  local_268 = local_288;
  local_260 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               *)__name._M_i;
  local_248 = local_288;
  local_238 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               *)__name._M_i;
  local_229._9_8_ = local_288;
  local_229._17_8_ = local_240;
  local_208 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               *)__name._M_i;
  local_1d0 = local_288;
  local_1c8 = local_240;
  local_1c0 = local_210;
  local_1b0 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               *)__name._M_i;
  do {
    boost::unordered::detail::foa::
    concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
    ::shared_access(in_stack_fffffffffffffca8);
    local_e0 = local_1b8;
    local_e8 = local_1c0;
    local_f0 = local_1c8;
    local_f8 = local_1d0;
    local_100 = local_1d8;
    local_d8 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                *)__name._M_i;
    local_108 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
                ::key_from<slang::ast::Scope_const*,std::nullopt_t>(local_1d0,local_1d8);
    local_110._M_i =
         boost::unordered::detail::foa::
         table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
         ::hash_for<slang::ast::Scope_const*>
                   (&in_stack_fffffffffffffc90->
                     super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                    ,(Scope **)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_118 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                ::position_for(&in_stack_fffffffffffffc90->
                                super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                               ,CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    do {
      boost::unordered::detail::foa::
      concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
      ::insert_counter(in_stack_fffffffffffffc90,
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_11c = std::__atomic_base::operator_cast_to_unsigned_int
                            ((__atomic_base<unsigned_int> *)in_stack_fffffffffffffc98);
      local_a0 = local_108;
      local_a8 = local_118;
      local_b0 = local_110._M_i;
      local_b8 = local_e8;
      local_c8 = local_e8;
      local_c0 = &local_89;
      local_18 = local_108;
      local_20 = local_118;
      local_28 = local_110._M_i;
      local_30 = &local_c8;
      local_98 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                  *)__name._M_i;
      local_10.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__name._M_i;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                ((pow2_quadratic_prober *)(local_70 + 0x30),local_118);
      do {
        local_70._40_8_ =
             boost::unordered::detail::foa::pow2_quadratic_prober::get
                       ((pow2_quadratic_prober *)(local_70 + 0x30));
        pgVar3 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                           *)0x9a2d5c);
        local_70._32_8_ = pgVar3 + local_70._40_8_;
        local_70._28_4_ =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>
             ::match((group15<boost::unordered::detail::foa::atomic_integral> *)
                     in_stack_fffffffffffffc98,(size_t)in_stack_fffffffffffffc90);
        if (local_70._28_4_ != 0) {
          local_70._16_8_ =
               boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               ::elements((table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                           *)0x9a2dba);
          local_70._16_8_ = local_70._16_8_ + local_70._40_8_ * 0xf * 0x18;
          boost::unordered::detail::foa::
          concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
          ::access((concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                    *)local_70,(char *)__name._M_i,(int)local_70._40_8_);
          do {
            local_74 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            bVar1 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::atomic_integral>::is_occupied
                              ((group15<boost::unordered::detail::foa::atomic_integral> *)
                               in_stack_fffffffffffffc90,
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            if (bVar1) {
              this_00 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                                *)0x9a2e4f);
              __x = local_18;
              __y = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
                    ::
                    key_from<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>
                              ((pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>
                                *)0x9a2e7d);
              bVar1 = std::equal_to<const_slang::ast::Scope_*>::operator()(this_00,__x,__y);
              if (bVar1) {
                boost::unordered::detail::foa::
                concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                ::
                unprotected_visit<std::integral_constant<bool,_false>,_const_slang::ast::Scope_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../external/boost_concurrent.hpp:12047:29)>
                ::anon_class_16_2_87ec82a1::operator()
                          ((anon_class_16_2_87ec82a1 *)in_stack_fffffffffffffcb0,
                           (group_type *)in_stack_fffffffffffffca8,
                           (uint)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                           in_stack_fffffffffffffc98);
                local_8 = 1;
                local_88 = 1;
                goto LAB_009a2f5d;
              }
            }
            local_70._28_4_ = local_70._28_4_ - 1 & local_70._28_4_;
          } while (local_70._28_4_ != 0);
          local_88 = 0;
LAB_009a2f5d:
          boost::unordered::detail::foa::shared_lock<boost::unordered::detail::foa::rw_spinlock>::
          ~shared_lock((shared_lock<boost::unordered::detail::foa::rw_spinlock> *)
                       in_stack_fffffffffffffc90);
          if (local_88 != 0) goto LAB_009a2fdd;
        }
        bVar1 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::atomic_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::atomic_integral> *)
                           in_stack_fffffffffffffc90,
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        if (bVar1) {
          local_8 = 0;
          goto LAB_009a2fdd;
        }
        bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          ((pow2_quadratic_prober *)(local_70 + 0x30),*(size_t *)(in_RDI + 0x30));
      } while (bVar1);
      local_8 = 0;
LAB_009a2fdd:
      if (local_8 != 0) {
        local_cc = 0;
        break;
      }
      boost::unordered::detail::foa::
      concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
      ::reserve_size::reserve_size
                ((reserve_size *)in_stack_fffffffffffffc90,
                 (concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      bVar1 = boost::unordered::detail::foa::
              concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              ::reserve_size::succeeded((reserve_size *)in_stack_fffffffffffffc90);
      if (bVar1) {
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  ((pow2_quadratic_prober *)(local_170 + 0x18),local_118);
        while( true ) {
          local_170._16_8_ =
               boost::unordered::detail::foa::pow2_quadratic_prober::get
                         ((pow2_quadratic_prober *)(local_170 + 0x18));
          local_170._8_8_ =
               boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               ::groups((table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                         *)0x9a3079);
          local_170._8_8_ = local_170._8_8_ + local_170._16_8_ * 0x10;
          boost::unordered::detail::foa::
          concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
          ::access((concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                    *)local_170,(char *)__name._M_i,(int)local_170._16_8_);
          local_174 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::atomic_integral>::match_available
                                ((group15<boost::unordered::detail::foa::atomic_integral> *)
                                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          if (local_174 == 0) {
            boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
            mark_overflow((group15<boost::unordered::detail::foa::atomic_integral> *)
                          in_stack_fffffffffffffc90,
                          CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            local_194 = 0;
          }
          else {
            local_178 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            boost::unordered::detail::foa::
            concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            ::reserve_slot::reserve_slot
                      (in_stack_fffffffffffffca0,(group_type *)in_stack_fffffffffffffc98,
                       (size_t)in_stack_fffffffffffffc90,
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            in_stack_fffffffffffffcb0 =
                 (concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                  *)boost::unordered::detail::foa::
                    concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                    ::insert_counter(in_stack_fffffffffffffc90,
                                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            _Var2 = std::__atomic_base<unsigned_int>::operator++
                              ((__atomic_base<unsigned_int> *)in_stack_fffffffffffffcb0,0);
            if (_Var2 == local_11c) {
              local_1a0 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                          ::elements((table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                                      *)0x9a31bc);
              local_1a0 = local_1a0 + local_170._16_8_ * 0xf + (ulong)local_178;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
              ::construct_element<slang::ast::Scope_const*,std::nullopt_t_const&>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                          *)__name._M_i,local_1a0,local_f8,local_100);
              boost::unordered::detail::foa::
              concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              ::reserve_slot::commit(&local_190);
              boost::unordered::detail::foa::
              concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              ::reserve_size::commit(&local_138);
              in_stack_fffffffffffffca0 = local_e0;
              pvVar4 = boost::unordered::detail::foa::
                       flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>
                       ::value_from(local_1a0);
              in_stack_fffffffffffffca8 =
                   (concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                    *)boost::unordered::detail::foa::
                      concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                      ::cast_for(pvVar4);
              boost::unordered::detail::foa::
              concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              ::
              emplace_or_visit_impl<std::integral_constant<bool,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../external/boost_concurrent.hpp:12047:29),_boost::unordered::detail::foa::try_emplace_args_t,_const_slang::ast::Scope_*,_const_std::nullopt_t_&>
              ::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_fffffffffffffca0,
                         (value_type *)in_stack_fffffffffffffca8);
              local_cc = 1;
              local_194 = 1;
            }
            else {
              local_194 = 4;
            }
            boost::unordered::detail::foa::
            concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            ::reserve_slot::~reserve_slot((reserve_slot *)in_stack_fffffffffffffc90);
          }
          boost::unordered::detail::foa::lock_guard<boost::unordered::detail::foa::rw_spinlock>::
          ~lock_guard((lock_guard<boost::unordered::detail::foa::rw_spinlock> *)0x9a32b8);
          if (local_194 != 0) break;
          boost::unordered::detail::foa::pow2_quadratic_prober::next
                    ((pow2_quadratic_prober *)(local_170 + 0x18),*(size_t *)(in_RDI + 0x30));
        }
      }
      else {
        local_cc = -1;
        local_194 = 1;
      }
      boost::unordered::detail::foa::
      concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
      ::reserve_size::~reserve_size((reserve_size *)in_stack_fffffffffffffc90);
    } while (local_194 != 1);
    local_1ec = local_cc;
    if (-1 < local_cc) {
      local_1a1 = local_cc != 0;
    }
    local_200 = (uint)(-1 < local_cc);
    in_stack_fffffffffffffc8c = local_cc;
    boost::unordered::detail::foa::
    reentrancy_checked<boost::unordered::detail::foa::shared_lock<boost::unordered::detail::foa::rw_spinlock>_>
    ::~reentrancy_checked
              ((reentrancy_checked<boost::unordered::detail::foa::shared_lock<boost::unordered::detail::foa::rw_spinlock>_>
                *)0x9a33fb);
    if (local_200 != 0) {
      if ((local_1a1 & 1) != 0) {
        BS::thread_pool<(unsigned_char)0>::
        detach_task<slang::analysis::AnalysisManager::analyzeScopeAsync(slang::ast::Scope_const&)::__0>
                  ((thread_pool<(unsigned_char)__x00_> *)in_stack_fffffffffffffcb0,
                   (anon_class_16_2_f87c7f41 *)in_stack_fffffffffffffca8,
                   (priority_t)((ulong)in_stack_fffffffffffffca0 >> 0x38));
      }
      return;
    }
    boost::unordered::detail::foa::
    concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
    ::rehash_if_full(in_stack_fffffffffffffcb0);
  } while( true );
}

Assistant:

void AnalysisManager::analyzeScopeAsync(const Scope& scope) {
    // Kick off a new analysis task if we haven't already seen
    // this scope before.
    if (analyzedScopes.try_emplace(&scope, std::nullopt)) {
        threadPool.detach_task([this, &scope] {
            SLANG_TRY {
                auto& result = analyzeScopeBlocking(scope);
                analyzedScopes.visit(&scope, [&result](auto& item) { item.second = &result; });
            }
            SLANG_CATCH(...) {
                std::unique_lock<std::mutex> lock(mutex);
                pendingException = std::current_exception();
            }
        });
    }